

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_number.c
# Opt level: O1

void assert_parse_number(char *string,int integer,double real)

{
  cJSON_bool cVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  parse_buffer buffer;
  parse_buffer local_58;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.length = 0;
  local_58.hooks.allocate = (_func_void_ptr_size_t *)0x0;
  local_58.hooks.deallocate = (_func_void_void_ptr *)0x0;
  local_58.offset = 0;
  local_58.depth = 0;
  local_58.hooks.reallocate = (_func_void_ptr_void_ptr_size_t *)0x0;
  local_58.content = (uchar *)string;
  sVar2 = strlen(string);
  local_58.length = sVar2 + 1;
  cVar1 = parse_number(item,&local_58);
  if (cVar1 == 0) {
    UnityFail(" Expected TRUE Was FALSE",0x34);
  }
  if (item[0].next != (cJSON *)0x0) {
    UnityFail("Linked list next pointer is not NULL.",0x25);
  }
  if (item[0].prev != (cJSON *)0x0) {
    UnityFail("Linked list previous pointer is not NULL.",0x25);
  }
  if (item[0].child != (cJSON *)0x0) {
    UnityFail("Item has a child.",0x26);
  }
  UnityAssertBits(0xff,8,(long)item[0].type,"Item doesn\'t have expected type.",0x27);
  UnityAssertBits(0x100,0,(long)item[0].type,"Item should not have a string as reference.",0x28);
  UnityAssertBits(0x200,0,(long)item[0].type,"Item should not have a const string.",0x29);
  if (item[0].valuestring != (char *)0x0) {
    UnityFail("Valuestring is not NULL.",0x2a);
  }
  if (item[0].string != (char *)0x0) {
    UnityFail("String is not NULL.",0x2b);
  }
  UnityAssertEqualNumber((long)integer,(long)item[0].valueint,0,0x36,0x14);
  UnityAssertDoublesWithin(SUB84(real * 1e-12,0),real,item[0].valuedouble,0,0x37);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void assert_parse_number(const char *string, int integer, double real)
{
    parse_buffer buffer = { 0, 0, 0, 0, { 0, 0, 0 } };
    buffer.content = (const unsigned char*)string;
    buffer.length = strlen(string) + sizeof("");

    TEST_ASSERT_TRUE(parse_number(item, &buffer));
    assert_is_number(item);
    TEST_ASSERT_EQUAL_INT(integer, item->valueint);
    TEST_ASSERT_EQUAL_DOUBLE(real, item->valuedouble);
}